

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_difference.hpp
# Opt level: O3

iterator_range<burst::symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_std::greater<void>_>_>
* __thiscall
burst::symmetric_difference_t::operator()
          (iterator_range<burst::symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_std::greater<void>_>_>
           *__return_storage_ptr__,symmetric_difference_t *this,
          tuple<const_std::forward_list<int,_std::allocator<int>_>_&,_const_std::__cxx11::list<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::deque<int,_std::allocator<int>_>_&>
          *args,greater<void> *args_1)

{
  symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_std::greater<void>_>
  end;
  symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_std::greater<void>_>
  begin;
  symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_std::greater<void>_>
  local_178;
  undefined8 local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  undefined8 local_118;
  undefined8 local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_108;
  undefined8 local_100;
  undefined8 local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  undefined8 local_e8;
  symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_std::greater<void>_>
  local_d8;
  undefined8 local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  undefined8 local_78;
  undefined8 local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_68;
  undefined8 local_60;
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  undefined8 local_48;
  deque<int,_std::allocator<int>_> *local_38;
  vector<int,_std::allocator<int>_> *pvStack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  local_38 = (args->
             super__Tuple_impl<0UL,_const_std::forward_list<int,_std::allocator<int>_>_&,_const_std::__cxx11::list<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::deque<int,_std::allocator<int>_>_&>
             ).
             super__Tuple_impl<1UL,_const_std::__cxx11::list<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::deque<int,_std::allocator<int>_>_&>
             .
             super__Tuple_impl<2UL,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::deque<int,_std::allocator<int>_>_&>
             .super__Tuple_impl<3UL,_const_std::deque<int,_std::allocator<int>_>_&>.
             super__Head_base<3UL,_const_std::deque<int,_std::allocator<int>_>_&,_false>.
             _M_head_impl;
  pvStack_30 = (args->
               super__Tuple_impl<0UL,_const_std::forward_list<int,_std::allocator<int>_>_&,_const_std::__cxx11::list<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::deque<int,_std::allocator<int>_>_&>
               ).
               super__Tuple_impl<1UL,_const_std::__cxx11::list<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::deque<int,_std::allocator<int>_>_&>
               .
               super__Tuple_impl<2UL,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::deque<int,_std::allocator<int>_>_&>
               .super__Head_base<2UL,_const_std::vector<int,_std::allocator<int>_>_&,_false>.
               _M_head_impl;
  local_28 = *(undefined4 *)
              &(args->
               super__Tuple_impl<0UL,_const_std::forward_list<int,_std::allocator<int>_>_&,_const_std::__cxx11::list<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::deque<int,_std::allocator<int>_>_&>
               ).
               super__Tuple_impl<1UL,_const_std::__cxx11::list<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::deque<int,_std::allocator<int>_>_&>
               .super__Head_base<1UL,_const_std::__cxx11::list<int,_std::allocator<int>_>_&,_false>.
               _M_head_impl;
  uStack_24 = *(undefined4 *)
               ((long)&(args->
                       super__Tuple_impl<0UL,_const_std::forward_list<int,_std::allocator<int>_>_&,_const_std::__cxx11::list<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::deque<int,_std::allocator<int>_>_&>
                       ).
                       super__Tuple_impl<1UL,_const_std::__cxx11::list<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::deque<int,_std::allocator<int>_>_&>
                       .
                       super__Head_base<1UL,_const_std::__cxx11::list<int,_std::allocator<int>_>_&,_false>
                       ._M_head_impl + 4);
  uStack_20 = *(undefined4 *)
               &(args->
                super__Tuple_impl<0UL,_const_std::forward_list<int,_std::allocator<int>_>_&,_const_std::__cxx11::list<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::deque<int,_std::allocator<int>_>_&>
                ).super__Head_base<0UL,_const_std::forward_list<int,_std::allocator<int>_>_&,_false>
                ._M_head_impl;
  uStack_1c = *(undefined4 *)
               ((long)&(args->
                       super__Tuple_impl<0UL,_const_std::forward_list<int,_std::allocator<int>_>_&,_const_std::__cxx11::list<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::deque<int,_std::allocator<int>_>_&>
                       ).
                       super__Head_base<0UL,_const_std::forward_list<int,_std::allocator<int>_>_&,_false>
                       ._M_head_impl + 4);
  make_symmetric_difference_iterator<std::forward_list<int,std::allocator<int>>const,std::__cxx11::list<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>const,std::deque<int,std::allocator<int>>const,std::greater<void>>
            (&local_88);
  symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_std::greater<void>_>
  ::symmetric_difference_iterator(&local_d8,&local_88);
  local_178.m_min_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_d8.m_min_end.m_container.
       super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_178.m_min_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_d8.m_min_end.m_container.
            super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_178.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_d8.m_end.m_container.
       super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_178.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_d8.m_end.m_container.
            super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_128 = local_88;
  p_Stack_120 = p_Stack_80;
  local_88 = 0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118 = local_78;
  local_110 = local_70;
  p_Stack_108 = p_Stack_68;
  local_70 = 0;
  p_Stack_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_100 = local_60;
  local_f8 = local_58;
  p_Stack_f0 = p_Stack_50;
  local_58 = 0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8 = local_48;
  local_178.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_d8.m_begin.m_container.
            super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_178.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_d8.m_begin.m_container.
       super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_d8.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_d8.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_178.m_begin.m_iterator._M_current = local_d8.m_begin.m_iterator._M_current;
  local_d8.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_d8.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_178.m_end.m_iterator._M_current = local_d8.m_end.m_iterator._M_current;
  local_d8.m_min_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_d8.m_min_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_178.m_min_end.m_iterator._M_current = local_d8.m_min_end.m_iterator._M_current;
  boost::
  make_iterator_range<burst::symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,std::_List_const_iterator<int>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int_const&,int_const*>>>,std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,std::_List_const_iterator<int>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int_const&,int_const*>>>>>>,std::greater<void>>>
            (__return_storage_ptr__,(boost *)&local_128,&local_178,
             (symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_std::greater<void>_>
              *)args_1);
  if (local_178.m_min_end.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.m_min_end.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_178.m_end.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.m_end.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_178.m_begin.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.m_begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
  }
  if (p_Stack_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_108);
  }
  if (p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
  }
  if (local_d8.m_min_end.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.m_min_end.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d8.m_end.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.m_end.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d8.m_begin.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.m_begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  if (p_Stack_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_68);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_symmetric_difference_iterator(std::forward<Args>(args)...);
            auto end = make_symmetric_difference_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }